

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O0

void ncnn::vresize_two(short *rows0p,short *rows1p,int wsize,uchar *Dp0,uchar *Dp1,short b0,short b1
                      ,short b2,short b3)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 *in_RCX;
  int in_EDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined8 *in_R8;
  short in_R9W;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i _Dp0;
  __m128i _acc11;
  __m128i _acc10;
  __m128i _acc01;
  __m128i _acc00;
  __m128i _r11;
  __m128i _r10;
  __m128i _r01;
  __m128i _r00;
  __m128i _v2;
  __m128i _b3;
  __m128i _b2;
  __m128i _b1;
  __m128i _b0;
  int dx;
  int local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined1 (*local_5b8) [16];
  undefined1 (*local_5b0) [16];
  short local_528;
  short sStack_526;
  short sStack_524;
  short sStack_522;
  short sStack_520;
  short sStack_51e;
  short sStack_51c;
  short sStack_51a;
  short local_518;
  short sStack_516;
  short sStack_514;
  short sStack_512;
  short sStack_510;
  short sStack_50e;
  short sStack_50c;
  short sStack_50a;
  short local_508;
  short sStack_506;
  short sStack_504;
  short sStack_502;
  short sStack_500;
  short sStack_4fe;
  short sStack_4fc;
  short sStack_4fa;
  short local_4f8;
  short sStack_4f6;
  short sStack_4f4;
  short sStack_4f2;
  short sStack_4f0;
  short sStack_4ee;
  short sStack_4ec;
  short sStack_4ea;
  short local_468;
  short sStack_466;
  short sStack_464;
  short sStack_462;
  short sStack_460;
  short sStack_45e;
  short sStack_45c;
  short sStack_45a;
  short local_458;
  short sStack_456;
  short sStack_454;
  short sStack_452;
  short sStack_450;
  short sStack_44e;
  short sStack_44c;
  short sStack_44a;
  short local_448;
  short sStack_446;
  short sStack_444;
  short sStack_442;
  short sStack_440;
  short sStack_43e;
  short sStack_43c;
  short sStack_43a;
  short local_438;
  short sStack_436;
  short sStack_434;
  short sStack_432;
  short sStack_430;
  short sStack_42e;
  short sStack_42c;
  short sStack_42a;
  short local_428;
  short sStack_426;
  short sStack_424;
  short sStack_422;
  short sStack_420;
  short sStack_41e;
  short sStack_41c;
  short sStack_41a;
  short local_418;
  short sStack_416;
  short sStack_414;
  short sStack_412;
  short sStack_410;
  short sStack_40e;
  short sStack_40c;
  short sStack_40a;
  short local_408;
  short sStack_406;
  short sStack_404;
  short sStack_402;
  short sStack_400;
  short sStack_3fe;
  short sStack_3fc;
  short sStack_3fa;
  short local_3f8;
  short sStack_3f6;
  short sStack_3f4;
  short sStack_3f2;
  short sStack_3f0;
  short sStack_3ee;
  short sStack_3ec;
  short sStack_3ea;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short s1;
  short s0;
  __m128i _Dp1_1;
  __m128i _Dp0_1;
  __m128i _acc1;
  __m128i _acc0;
  __m128i _r1;
  __m128i _r0;
  __m128i _Dp1;
  
  uVar17 = CONCAT26(in_R9W,CONCAT24(in_R9W,CONCAT22(in_R9W,in_R9W)));
  uVar18 = CONCAT26(in_R9W,CONCAT24(in_R9W,CONCAT22(in_R9W,in_R9W)));
  uVar19 = CONCAT26((short)_Dp0[1],CONCAT24((short)_Dp0[1],CONCAT22((short)_Dp0[1],(short)_Dp0[1])))
  ;
  uVar20 = CONCAT26((short)_Dp0[1],CONCAT24((short)_Dp0[1],CONCAT22((short)_Dp0[1],(short)_Dp0[1])))
  ;
  uVar21 = CONCAT26((short)_acc11[0],
                    CONCAT24((short)_acc11[0],CONCAT22((short)_acc11[0],(short)_acc11[0])));
  uVar22 = CONCAT26((short)_acc11[0],
                    CONCAT24((short)_acc11[0],CONCAT22((short)_acc11[0],(short)_acc11[0])));
  uVar23 = CONCAT26((short)_acc11[1],
                    CONCAT24((short)_acc11[1],CONCAT22((short)_acc11[1],(short)_acc11[1])));
  uVar24 = CONCAT26((short)_acc11[1],
                    CONCAT24((short)_acc11[1],CONCAT22((short)_acc11[1],(short)_acc11[1])));
  local_5d0 = in_R8;
  local_5c8 = in_RCX;
  local_5b8 = in_RSI;
  local_5b0 = in_RDI;
  for (local_5d8 = 0; local_5d8 + 0xf < in_EDX; local_5d8 = local_5d8 + 0x10) {
    auVar10._8_8_ = uVar18;
    auVar10._0_8_ = uVar17;
    auVar28 = pmulhw(*local_5b0,auVar10);
    auVar9._8_8_ = uVar20;
    auVar9._0_8_ = uVar19;
    auVar25 = pmulhw(*local_5b8,auVar9);
    local_3f8 = auVar28._0_2_;
    sStack_3f6 = auVar28._2_2_;
    sStack_3f4 = auVar28._4_2_;
    sStack_3f2 = auVar28._6_2_;
    sStack_3f0 = auVar28._8_2_;
    sStack_3ee = auVar28._10_2_;
    sStack_3ec = auVar28._12_2_;
    sStack_3ea = auVar28._14_2_;
    local_408 = auVar25._0_2_;
    sStack_406 = auVar25._2_2_;
    sStack_404 = auVar25._4_2_;
    sStack_402 = auVar25._6_2_;
    sStack_400 = auVar25._8_2_;
    sStack_3fe = auVar25._10_2_;
    sStack_3fc = auVar25._12_2_;
    sStack_3fa = auVar25._14_2_;
    auVar8._8_8_ = uVar18;
    auVar8._0_8_ = uVar17;
    auVar28 = pmulhw(local_5b0[1],auVar8);
    auVar7._8_8_ = uVar20;
    auVar7._0_8_ = uVar19;
    auVar25 = pmulhw(local_5b8[1],auVar7);
    local_418 = auVar28._0_2_;
    sStack_416 = auVar28._2_2_;
    sStack_414 = auVar28._4_2_;
    sStack_412 = auVar28._6_2_;
    sStack_410 = auVar28._8_2_;
    sStack_40e = auVar28._10_2_;
    sStack_40c = auVar28._12_2_;
    sStack_40a = auVar28._14_2_;
    local_428 = auVar25._0_2_;
    sStack_426 = auVar25._2_2_;
    sStack_424 = auVar25._4_2_;
    sStack_422 = auVar25._6_2_;
    sStack_420 = auVar25._8_2_;
    sStack_41e = auVar25._10_2_;
    sStack_41c = auVar25._12_2_;
    sStack_41a = auVar25._14_2_;
    auVar27._8_8_ = uVar22;
    auVar27._0_8_ = uVar21;
    auVar28 = pmulhw(*local_5b0,auVar27);
    auVar26._8_8_ = uVar24;
    auVar26._0_8_ = uVar23;
    auVar25 = pmulhw(*local_5b8,auVar26);
    local_438 = auVar28._0_2_;
    sStack_436 = auVar28._2_2_;
    sStack_434 = auVar28._4_2_;
    sStack_432 = auVar28._6_2_;
    sStack_430 = auVar28._8_2_;
    sStack_42e = auVar28._10_2_;
    sStack_42c = auVar28._12_2_;
    sStack_42a = auVar28._14_2_;
    local_448 = auVar25._0_2_;
    sStack_446 = auVar25._2_2_;
    sStack_444 = auVar25._4_2_;
    sStack_442 = auVar25._6_2_;
    sStack_440 = auVar25._8_2_;
    sStack_43e = auVar25._10_2_;
    sStack_43c = auVar25._12_2_;
    sStack_43a = auVar25._14_2_;
    auVar28._8_8_ = uVar22;
    auVar28._0_8_ = uVar21;
    auVar28 = pmulhw(local_5b0[1],auVar28);
    auVar25._8_8_ = uVar24;
    auVar25._0_8_ = uVar23;
    auVar25 = pmulhw(local_5b8[1],auVar25);
    local_458 = auVar28._0_2_;
    sStack_456 = auVar28._2_2_;
    sStack_454 = auVar28._4_2_;
    sStack_452 = auVar28._6_2_;
    sStack_450 = auVar28._8_2_;
    sStack_44e = auVar28._10_2_;
    sStack_44c = auVar28._12_2_;
    sStack_44a = auVar28._14_2_;
    local_468 = auVar25._0_2_;
    sStack_466 = auVar25._2_2_;
    sStack_464 = auVar25._4_2_;
    sStack_462 = auVar25._6_2_;
    sStack_460 = auVar25._8_2_;
    sStack_45e = auVar25._10_2_;
    sStack_45c = auVar25._12_2_;
    sStack_45a = auVar25._14_2_;
    auVar16._2_2_ = sStack_3f6 + sStack_406 + 2;
    auVar16._0_2_ = local_3f8 + local_408 + 2;
    auVar16._4_2_ = sStack_3f4 + sStack_404 + 2;
    auVar16._6_2_ = sStack_3f2 + sStack_402 + 2;
    auVar16._8_2_ = sStack_3f0 + sStack_400 + 2;
    auVar16._10_2_ = sStack_3ee + sStack_3fe + 2;
    auVar16._12_2_ = sStack_3ec + sStack_3fc + 2;
    auVar16._14_2_ = sStack_3ea + sStack_3fa + 2;
    auVar25 = psraw(auVar16,ZEXT416(2));
    auVar15._2_2_ = sStack_416 + sStack_426 + 2;
    auVar15._0_2_ = local_418 + local_428 + 2;
    auVar15._4_2_ = sStack_414 + sStack_424 + 2;
    auVar15._6_2_ = sStack_412 + sStack_422 + 2;
    auVar15._8_2_ = sStack_410 + sStack_420 + 2;
    auVar15._10_2_ = sStack_40e + sStack_41e + 2;
    auVar15._12_2_ = sStack_40c + sStack_41c + 2;
    auVar15._14_2_ = sStack_40a + sStack_41a + 2;
    auVar28 = psraw(auVar15,ZEXT416(2));
    auVar14._2_2_ = sStack_436 + sStack_446 + 2;
    auVar14._0_2_ = local_438 + local_448 + 2;
    auVar14._4_2_ = sStack_434 + sStack_444 + 2;
    auVar14._6_2_ = sStack_432 + sStack_442 + 2;
    auVar14._8_2_ = sStack_430 + sStack_440 + 2;
    auVar14._10_2_ = sStack_42e + sStack_43e + 2;
    auVar14._12_2_ = sStack_42c + sStack_43c + 2;
    auVar14._14_2_ = sStack_42a + sStack_43a + 2;
    auVar26 = psraw(auVar14,ZEXT416(2));
    auVar13._2_2_ = sStack_456 + sStack_466 + 2;
    auVar13._0_2_ = local_458 + local_468 + 2;
    auVar13._4_2_ = sStack_454 + sStack_464 + 2;
    auVar13._6_2_ = sStack_452 + sStack_462 + 2;
    auVar13._8_2_ = sStack_450 + sStack_460 + 2;
    auVar13._10_2_ = sStack_44e + sStack_45e + 2;
    auVar13._12_2_ = sStack_44c + sStack_45c + 2;
    auVar13._14_2_ = sStack_44a + sStack_45a + 2;
    auVar27 = psraw(auVar13,ZEXT416(2));
    local_138 = auVar25._0_2_;
    sStack_136 = auVar25._2_2_;
    sStack_134 = auVar25._4_2_;
    sStack_132 = auVar25._6_2_;
    sStack_130 = auVar25._8_2_;
    sStack_12e = auVar25._10_2_;
    sStack_12c = auVar25._12_2_;
    sStack_12a = auVar25._14_2_;
    local_148 = auVar28._0_2_;
    sStack_146 = auVar28._2_2_;
    sStack_144 = auVar28._4_2_;
    sStack_142 = auVar28._6_2_;
    sStack_140 = auVar28._8_2_;
    sStack_13e = auVar28._10_2_;
    sStack_13c = auVar28._12_2_;
    sStack_13a = auVar28._14_2_;
    local_158 = auVar26._0_2_;
    sStack_156 = auVar26._2_2_;
    sStack_154 = auVar26._4_2_;
    sStack_152 = auVar26._6_2_;
    sStack_150 = auVar26._8_2_;
    sStack_14e = auVar26._10_2_;
    sStack_14c = auVar26._12_2_;
    sStack_14a = auVar26._14_2_;
    local_168 = auVar27._0_2_;
    sStack_166 = auVar27._2_2_;
    sStack_164 = auVar27._4_2_;
    sStack_162 = auVar27._6_2_;
    sStack_160 = auVar27._8_2_;
    sStack_15e = auVar27._10_2_;
    sStack_15c = auVar27._12_2_;
    sStack_15a = auVar27._14_2_;
    *local_5c8 = CONCAT17((0 < sStack_12a) * (sStack_12a < 0x100) * auVar25[0xe] -
                          (0xff < sStack_12a),
                          CONCAT16((0 < sStack_12c) * (sStack_12c < 0x100) * auVar25[0xc] -
                                   (0xff < sStack_12c),
                                   CONCAT15((0 < sStack_12e) * (sStack_12e < 0x100) * auVar25[10] -
                                            (0xff < sStack_12e),
                                            CONCAT14((0 < sStack_130) * (sStack_130 < 0x100) *
                                                     auVar25[8] - (0xff < sStack_130),
                                                     CONCAT13((0 < sStack_132) *
                                                              (sStack_132 < 0x100) * auVar25[6] -
                                                              (0xff < sStack_132),
                                                              CONCAT12((0 < sStack_134) *
                                                                       (sStack_134 < 0x100) *
                                                                       auVar25[4] -
                                                                       (0xff < sStack_134),
                                                                       CONCAT11((0 < sStack_136) *
                                                                                (sStack_136 < 0x100)
                                                                                * auVar25[2] -
                                                                                (0xff < sStack_136),
                                                                                (0 < local_138) *
                                                                                (local_138 < 0x100)
                                                                                * auVar25[0] -
                                                                                (0xff < local_138)))
                                                             )))));
    local_5c8[1] = CONCAT17((0 < sStack_13a) * (sStack_13a < 0x100) * auVar28[0xe] -
                            (0xff < sStack_13a),
                            CONCAT16((0 < sStack_13c) * (sStack_13c < 0x100) * auVar28[0xc] -
                                     (0xff < sStack_13c),
                                     CONCAT15((0 < sStack_13e) * (sStack_13e < 0x100) * auVar28[10]
                                              - (0xff < sStack_13e),
                                              CONCAT14((0 < sStack_140) * (sStack_140 < 0x100) *
                                                       auVar28[8] - (0xff < sStack_140),
                                                       CONCAT13((0 < sStack_142) *
                                                                (sStack_142 < 0x100) * auVar28[6] -
                                                                (0xff < sStack_142),
                                                                CONCAT12((0 < sStack_144) *
                                                                         (sStack_144 < 0x100) *
                                                                         auVar28[4] -
                                                                         (0xff < sStack_144),
                                                                         CONCAT11((0 < sStack_146) *
                                                                                  (sStack_146 <
                                                                                  0x100) * auVar28[2
                                                  ] - (0xff < sStack_146),
                                                  (0 < local_148) * (local_148 < 0x100) * auVar28[0]
                                                  - (0xff < local_148))))))));
    *local_5d0 = CONCAT17((0 < sStack_14a) * (sStack_14a < 0x100) * auVar26[0xe] -
                          (0xff < sStack_14a),
                          CONCAT16((0 < sStack_14c) * (sStack_14c < 0x100) * auVar26[0xc] -
                                   (0xff < sStack_14c),
                                   CONCAT15((0 < sStack_14e) * (sStack_14e < 0x100) * auVar26[10] -
                                            (0xff < sStack_14e),
                                            CONCAT14((0 < sStack_150) * (sStack_150 < 0x100) *
                                                     auVar26[8] - (0xff < sStack_150),
                                                     CONCAT13((0 < sStack_152) *
                                                              (sStack_152 < 0x100) * auVar26[6] -
                                                              (0xff < sStack_152),
                                                              CONCAT12((0 < sStack_154) *
                                                                       (sStack_154 < 0x100) *
                                                                       auVar26[4] -
                                                                       (0xff < sStack_154),
                                                                       CONCAT11((0 < sStack_156) *
                                                                                (sStack_156 < 0x100)
                                                                                * auVar26[2] -
                                                                                (0xff < sStack_156),
                                                                                (0 < local_158) *
                                                                                (local_158 < 0x100)
                                                                                * auVar26[0] -
                                                                                (0xff < local_158)))
                                                             )))));
    local_5d0[1] = CONCAT17((0 < sStack_15a) * (sStack_15a < 0x100) * auVar27[0xe] -
                            (0xff < sStack_15a),
                            CONCAT16((0 < sStack_15c) * (sStack_15c < 0x100) * auVar27[0xc] -
                                     (0xff < sStack_15c),
                                     CONCAT15((0 < sStack_15e) * (sStack_15e < 0x100) * auVar27[10]
                                              - (0xff < sStack_15e),
                                              CONCAT14((0 < sStack_160) * (sStack_160 < 0x100) *
                                                       auVar27[8] - (0xff < sStack_160),
                                                       CONCAT13((0 < sStack_162) *
                                                                (sStack_162 < 0x100) * auVar27[6] -
                                                                (0xff < sStack_162),
                                                                CONCAT12((0 < sStack_164) *
                                                                         (sStack_164 < 0x100) *
                                                                         auVar27[4] -
                                                                         (0xff < sStack_164),
                                                                         CONCAT11((0 < sStack_166) *
                                                                                  (sStack_166 <
                                                                                  0x100) * auVar27[2
                                                  ] - (0xff < sStack_166),
                                                  (0 < local_168) * (local_168 < 0x100) * auVar27[0]
                                                  - (0xff < local_168))))))));
    local_5c8 = local_5c8 + 2;
    local_5d0 = local_5d0 + 2;
    local_5b0 = local_5b0 + 2;
    local_5b8 = local_5b8 + 2;
  }
  for (; local_5d8 + 7 < in_EDX; local_5d8 = local_5d8 + 8) {
    auVar6._8_8_ = uVar18;
    auVar6._0_8_ = uVar17;
    auVar28 = pmulhw(*local_5b0,auVar6);
    auVar5._8_8_ = uVar20;
    auVar5._0_8_ = uVar19;
    auVar25 = pmulhw(*local_5b8,auVar5);
    local_4f8 = auVar28._0_2_;
    sStack_4f6 = auVar28._2_2_;
    sStack_4f4 = auVar28._4_2_;
    sStack_4f2 = auVar28._6_2_;
    sStack_4f0 = auVar28._8_2_;
    sStack_4ee = auVar28._10_2_;
    sStack_4ec = auVar28._12_2_;
    sStack_4ea = auVar28._14_2_;
    local_508 = auVar25._0_2_;
    sStack_506 = auVar25._2_2_;
    sStack_504 = auVar25._4_2_;
    sStack_502 = auVar25._6_2_;
    sStack_500 = auVar25._8_2_;
    sStack_4fe = auVar25._10_2_;
    sStack_4fc = auVar25._12_2_;
    sStack_4fa = auVar25._14_2_;
    auVar4._8_8_ = uVar22;
    auVar4._0_8_ = uVar21;
    auVar28 = pmulhw(*local_5b0,auVar4);
    auVar3._8_8_ = uVar24;
    auVar3._0_8_ = uVar23;
    auVar25 = pmulhw(*local_5b8,auVar3);
    local_518 = auVar28._0_2_;
    sStack_516 = auVar28._2_2_;
    sStack_514 = auVar28._4_2_;
    sStack_512 = auVar28._6_2_;
    sStack_510 = auVar28._8_2_;
    sStack_50e = auVar28._10_2_;
    sStack_50c = auVar28._12_2_;
    sStack_50a = auVar28._14_2_;
    local_528 = auVar25._0_2_;
    sStack_526 = auVar25._2_2_;
    sStack_524 = auVar25._4_2_;
    sStack_522 = auVar25._6_2_;
    sStack_520 = auVar25._8_2_;
    sStack_51e = auVar25._10_2_;
    sStack_51c = auVar25._12_2_;
    sStack_51a = auVar25._14_2_;
    auVar12._2_2_ = sStack_4f6 + sStack_506 + 2;
    auVar12._0_2_ = local_4f8 + local_508 + 2;
    auVar12._4_2_ = sStack_4f4 + sStack_504 + 2;
    auVar12._6_2_ = sStack_4f2 + sStack_502 + 2;
    auVar12._8_2_ = sStack_4f0 + sStack_500 + 2;
    auVar12._10_2_ = sStack_4ee + sStack_4fe + 2;
    auVar12._12_2_ = sStack_4ec + sStack_4fc + 2;
    auVar12._14_2_ = sStack_4ea + sStack_4fa + 2;
    auVar25 = psraw(auVar12,ZEXT416(2));
    auVar11._2_2_ = sStack_516 + sStack_526 + 2;
    auVar11._0_2_ = local_518 + local_528 + 2;
    auVar11._4_2_ = sStack_514 + sStack_524 + 2;
    auVar11._6_2_ = sStack_512 + sStack_522 + 2;
    auVar11._8_2_ = sStack_510 + sStack_520 + 2;
    auVar11._10_2_ = sStack_50e + sStack_51e + 2;
    auVar11._12_2_ = sStack_50c + sStack_51c + 2;
    auVar11._14_2_ = sStack_50a + sStack_51a + 2;
    auVar28 = psraw(auVar11,ZEXT416(2));
    local_178 = auVar25._0_2_;
    sStack_176 = auVar25._2_2_;
    sStack_174 = auVar25._4_2_;
    sStack_172 = auVar25._6_2_;
    sStack_170 = auVar25._8_2_;
    sStack_16e = auVar25._10_2_;
    sStack_16c = auVar25._12_2_;
    sStack_16a = auVar25._14_2_;
    local_198 = auVar28._0_2_;
    sStack_196 = auVar28._2_2_;
    sStack_194 = auVar28._4_2_;
    sStack_192 = auVar28._6_2_;
    sStack_190 = auVar28._8_2_;
    sStack_18e = auVar28._10_2_;
    sStack_18c = auVar28._12_2_;
    sStack_18a = auVar28._14_2_;
    *local_5c8 = CONCAT17((0 < sStack_16a) * (sStack_16a < 0x100) * auVar25[0xe] -
                          (0xff < sStack_16a),
                          CONCAT16((0 < sStack_16c) * (sStack_16c < 0x100) * auVar25[0xc] -
                                   (0xff < sStack_16c),
                                   CONCAT15((0 < sStack_16e) * (sStack_16e < 0x100) * auVar25[10] -
                                            (0xff < sStack_16e),
                                            CONCAT14((0 < sStack_170) * (sStack_170 < 0x100) *
                                                     auVar25[8] - (0xff < sStack_170),
                                                     CONCAT13((0 < sStack_172) *
                                                              (sStack_172 < 0x100) * auVar25[6] -
                                                              (0xff < sStack_172),
                                                              CONCAT12((0 < sStack_174) *
                                                                       (sStack_174 < 0x100) *
                                                                       auVar25[4] -
                                                                       (0xff < sStack_174),
                                                                       CONCAT11((0 < sStack_176) *
                                                                                (sStack_176 < 0x100)
                                                                                * auVar25[2] -
                                                                                (0xff < sStack_176),
                                                                                (0 < local_178) *
                                                                                (local_178 < 0x100)
                                                                                * auVar25[0] -
                                                                                (0xff < local_178)))
                                                             )))));
    *local_5d0 = CONCAT17((0 < sStack_18a) * (sStack_18a < 0x100) * auVar28[0xe] -
                          (0xff < sStack_18a),
                          CONCAT16((0 < sStack_18c) * (sStack_18c < 0x100) * auVar28[0xc] -
                                   (0xff < sStack_18c),
                                   CONCAT15((0 < sStack_18e) * (sStack_18e < 0x100) * auVar28[10] -
                                            (0xff < sStack_18e),
                                            CONCAT14((0 < sStack_190) * (sStack_190 < 0x100) *
                                                     auVar28[8] - (0xff < sStack_190),
                                                     CONCAT13((0 < sStack_192) *
                                                              (sStack_192 < 0x100) * auVar28[6] -
                                                              (0xff < sStack_192),
                                                              CONCAT12((0 < sStack_194) *
                                                                       (sStack_194 < 0x100) *
                                                                       auVar28[4] -
                                                                       (0xff < sStack_194),
                                                                       CONCAT11((0 < sStack_196) *
                                                                                (sStack_196 < 0x100)
                                                                                * auVar28[2] -
                                                                                (0xff < sStack_196),
                                                                                (0 < local_198) *
                                                                                (local_198 < 0x100)
                                                                                * auVar28[0] -
                                                                                (0xff < local_198)))
                                                             )))));
    local_5c8 = local_5c8 + 1;
    local_5d0 = local_5d0 + 1;
    local_5b0 = local_5b0 + 1;
    local_5b8 = local_5b8 + 1;
  }
  for (; local_5d8 < in_EDX; local_5d8 = local_5d8 + 1) {
    sVar1 = *(short *)*local_5b0;
    sVar2 = *(short *)*local_5b8;
    *(char *)local_5c8 =
         (char)((int)(short)((uint)((int)in_R9W * (int)sVar1) >> 0x10) +
                (int)(short)((uint)((int)(short)_Dp0[1] * (int)sVar2) >> 0x10) + 2 >> 2);
    *(char *)local_5d0 =
         (char)((int)(short)((uint)((int)(short)_acc11[0] * (int)sVar1) >> 0x10) +
                (int)(short)((uint)((int)(short)_acc11[1] * (int)sVar2) >> 0x10) + 2 >> 2);
    local_5d0 = (undefined8 *)((long)local_5d0 + 1);
    local_5c8 = (undefined8 *)((long)local_5c8 + 1);
    local_5b8 = (undefined1 (*) [16])(*local_5b8 + 2);
    local_5b0 = (undefined1 (*) [16])(*local_5b0 + 2);
  }
  return;
}

Assistant:

static void vresize_two(const short* rows0p, const short* rows1p, int wsize, unsigned char* Dp0, unsigned char* Dp1, short b0, short b1, short b2, short b3)
{
    int dx = 0;
#if __ARM_NEON
    int16x8_t _b0 = vdupq_n_s16(b0);
    int16x8_t _b1 = vdupq_n_s16(b1);
    int16x8_t _b2 = vdupq_n_s16(b2);
    int16x8_t _b3 = vdupq_n_s16(b3);
    for (; dx + 15 < wsize; dx += 16)
    {
        int16x8_t _r00 = vld1q_s16(rows0p);
        int16x8_t _r01 = vld1q_s16(rows0p + 8);
        int16x8_t _r10 = vld1q_s16(rows1p);
        int16x8_t _r11 = vld1q_s16(rows1p + 8);
        int16x8_t _acc00 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r00, _b0), 1), vqdmulhq_s16(_r10, _b1), 1);
        int16x8_t _acc01 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r01, _b0), 1), vqdmulhq_s16(_r11, _b1), 1);
        int16x8_t _acc10 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r00, _b2), 1), vqdmulhq_s16(_r10, _b3), 1);
        int16x8_t _acc11 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r01, _b2), 1), vqdmulhq_s16(_r11, _b3), 1);
        uint8x16_t _Dp0 = vcombine_u8(vqrshrun_n_s16(_acc00, 2), vqrshrun_n_s16(_acc01, 2));
        uint8x16_t _Dp1 = vcombine_u8(vqrshrun_n_s16(_acc10, 2), vqrshrun_n_s16(_acc11, 2));
        vst1q_u8(Dp0, _Dp0);
        vst1q_u8(Dp1, _Dp1);
        Dp0 += 16;
        Dp1 += 16;
        rows0p += 16;
        rows1p += 16;
    }
    for (; dx + 7 < wsize; dx += 8)
    {
        int16x8_t _r0 = vld1q_s16(rows0p);
        int16x8_t _r1 = vld1q_s16(rows1p);
        int16x8_t _acc0 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r0, _b0), 1), vqdmulhq_s16(_r1, _b1), 1);
        int16x8_t _acc1 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r0, _b2), 1), vqdmulhq_s16(_r1, _b3), 1);
        uint8x8_t _Dp0 = vqrshrun_n_s16(_acc0, 2);
        uint8x8_t _Dp1 = vqrshrun_n_s16(_acc1, 2);
        vst1_u8(Dp0, _Dp0);
        vst1_u8(Dp1, _Dp1);
        Dp0 += 8;
        Dp1 += 8;
        rows0p += 8;
        rows1p += 8;
    }
#endif // __ARM_NEON
#if __SSE2__
    __m128i _b0 = _mm_set1_epi16(b0);
    __m128i _b1 = _mm_set1_epi16(b1);
    __m128i _b2 = _mm_set1_epi16(b2);
    __m128i _b3 = _mm_set1_epi16(b3);
    __m128i _v2 = _mm_set1_epi16(2);
    for (; dx + 15 < wsize; dx += 16)
    {
        __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
        __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
        __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
        __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
        __m128i _acc00 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
        __m128i _acc01 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
        __m128i _acc10 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b2), _mm_mulhi_epi16(_r10, _b3));
        __m128i _acc11 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b2), _mm_mulhi_epi16(_r11, _b3));
        _acc00 = _mm_srai_epi16(_mm_add_epi16(_acc00, _v2), 2);
        _acc01 = _mm_srai_epi16(_mm_add_epi16(_acc01, _v2), 2);
        _acc10 = _mm_srai_epi16(_mm_add_epi16(_acc10, _v2), 2);
        _acc11 = _mm_srai_epi16(_mm_add_epi16(_acc11, _v2), 2);
        __m128i _Dp0 = _mm_packus_epi16(_acc00, _acc01);
        __m128i _Dp1 = _mm_packus_epi16(_acc10, _acc11);
        _mm_storeu_si128((__m128i*)Dp0, _Dp0);
        _mm_storeu_si128((__m128i*)Dp1, _Dp1);
        Dp0 += 16;
        Dp1 += 16;
        rows0p += 16;
        rows1p += 16;
    }
    for (; dx + 7 < wsize; dx += 8)
    {
        __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
        __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
        __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
        __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b2), _mm_mulhi_epi16(_r1, _b3));
        _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
        _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
        __m128i _Dp0 = _mm_packus_epi16(_acc0, _acc0);
        __m128i _Dp1 = _mm_packus_epi16(_acc1, _acc1);
        _mm_storel_epi64((__m128i*)Dp0, _Dp0);
        _mm_storel_epi64((__m128i*)Dp1, _Dp1);
        Dp0 += 8;
        Dp1 += 8;
        rows0p += 8;
        rows1p += 8;
    }
#endif // __SSE2__
    for (; dx < wsize; dx++)
    {
        short s0 = *rows0p++;
        short s1 = *rows1p++;

        *Dp0++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
        *Dp1++ = (unsigned char)(((short)((b2 * s0) >> 16) + (short)((b3 * s1) >> 16) + 2) >> 2);
    }
}